

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bytedata256.cpp
# Opt level: O2

void __thiscall ByteData256_BytesConstructor_Test::TestBody(ByteData256_BytesConstructor_Test *this)

{
  byte bVar1;
  bool bVar2;
  size_t i;
  ulong uVar3;
  char *message;
  char *in_R9;
  AssertHelper AStack_88;
  string local_80;
  AssertHelper local_60;
  AssertionResult gtest_ar;
  vector<unsigned_char,_std::allocator<unsigned_char>_> target;
  ByteData256 byte_data;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&target,0x20,(allocator_type *)&local_80);
  bVar1 = 1;
  for (uVar3 = 0;
      uVar3 < (ulong)((long)target.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)target.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_start); uVar3 = uVar3 + 1) {
    target.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[uVar3] = bVar1;
    bVar1 = bVar1 + 1;
    if (9 < bVar1) {
      bVar1 = 0;
    }
  }
  cfd::core::ByteData256::ByteData256(&byte_data,&target);
  cfd::core::ByteData256::GetBytes
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_80,&byte_data);
  bVar2 = std::operator==((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_80,&target
                         );
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_80);
  cfd::core::ByteData256::GetHex_abi_cxx11_(&local_80,&byte_data);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"byte_data.GetHex().c_str()",
             "\"0102030405060708090001020304050607080900010203040506070809000102\"",
             local_80._M_dataplus._M_p,
             "0102030405060708090001020304050607080900010203040506070809000102");
  std::__cxx11::string::~string((string *)&local_80);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_80);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_bytedata256.cpp"
               ,0x43,message);
    testing::internal::AssertHelper::operator=(&AStack_88,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&AStack_88);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_80);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  gtest_ar.success_ = bVar2;
  if (!bVar2) {
    testing::Message::Message((Message *)&AStack_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_80,(internal *)&gtest_ar,(AssertionResult *)"is_equals","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_bytedata256.cpp"
               ,0x44,local_80._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&AStack_88);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&AStack_88);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&byte_data);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&target.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return;
}

Assistant:

TEST(ByteData256, BytesConstructor) {
  std::vector<uint8_t> target(32);
  uint8_t byte = 1;
  for (size_t i = 0; i < target.size(); i++) {
    target[i] = byte;
    byte++;
    if (byte > 9) {
      byte = 0;
    }
  }
  ByteData256 byte_data = ByteData256(target);
  bool is_equals = (byte_data.GetBytes() == target);

  EXPECT_STREQ(
      byte_data.GetHex().c_str(),
      "0102030405060708090001020304050607080900010203040506070809000102");
  EXPECT_TRUE(is_equals);
}